

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  LogMessage *pLVar5;
  FastFieldValuePrinter *pFVar6;
  Message *message_00;
  uint64_t uVar7;
  int64_t iVar8;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar9;
  undefined8 *puVar10;
  long lVar11;
  _func_void_FieldDescriptor_ptr *p_Var12;
  undefined4 uVar13;
  string scratch;
  string truncated_value;
  LogFinisher local_101;
  string local_100;
  undefined1 local_e0 [24];
  _Alloc_hider _Stack_c8;
  FieldDescriptor *local_a8 [2];
  FieldDescriptor local_98 [16];
  string local_88;
  LogMessage local_68;
  
  if (index != -1 && (~(byte)field[1] & 0x60) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x9cd);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)local_e0,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  pFVar6 = GetFieldPrinter(this,field);
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_100._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_e0,
               (FieldDescriptor **)&local_100);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar4 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetInt32(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[3])(pFVar6,(ulong)uVar4,generator);
    break;
  case 2:
    if ((~(byte)field[1] & 0x60) == 0) {
      iVar8 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      iVar8 = Reflection::GetInt64(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[5])(pFVar6,iVar8,generator);
    break;
  case 3:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar4 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetUInt32(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[4])(pFVar6,(ulong)uVar4,generator);
    break;
  case 4:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar7 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar7 = Reflection::GetUInt64(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[6])(pFVar6,uVar7,generator);
    break;
  case 5:
    if ((~(byte)field[1] & 0x60) == 0) {
      dVar2 = Reflection::GetRepeatedDouble(reflection,message,field,index);
      uVar13 = SUB84(dVar2,0);
    }
    else {
      dVar2 = Reflection::GetDouble(reflection,message,field);
      uVar13 = SUB84(dVar2,0);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[8])(uVar13,pFVar6,generator);
    break;
  case 6:
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[7])(pFVar6,generator);
    break;
  case 7:
    if ((~(byte)field[1] & 0x60) == 0) {
      bVar3 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar3 = Reflection::GetBool(reflection,message,field);
    }
    (*pFVar6->_vptr_FastFieldValuePrinter[2])(pFVar6,(ulong)bVar3,generator);
    break;
  case 8:
    if ((~(byte)field[1] & 0x60) == 0) {
      uVar4 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar4 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar9 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
    if (pEVar9 != (EnumValueDescriptor *)0x0) {
      (*pFVar6->_vptr_FastFieldValuePrinter[0xb])
                (pFVar6,(ulong)uVar4,*(undefined8 *)(pEVar9 + 8),generator);
      return;
    }
    p_Var12 = (_func_void_FieldDescriptor_ptr *)(local_e0 + 0x10);
    local_e0._0_8_ = p_Var12;
    local_e0._8_8_ = FastInt32ToBufferLeft(uVar4,(char *)p_Var12);
    local_e0._8_8_ = local_e0._8_8_ + -(long)p_Var12;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,local_e0._0_8_,(char *)(local_e0._8_8_ + local_e0._0_8_));
    (*pFVar6->_vptr_FastFieldValuePrinter[0xb])(pFVar6,(ulong)uVar4,&local_100,generator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) {
      return;
    }
    goto LAB_003b9d89;
  case 9:
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    if ((~(byte)field[1] & 0x60) == 0) {
      this_00 = Reflection::GetRepeatedStringReference(reflection,message,field,index,&local_100);
    }
    else {
      this_00 = Reflection::GetStringReference(reflection,message,field,&local_100);
    }
    paVar1 = &local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar1;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)this_00);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)local_a8);
      p_Var12 = (_func_void_FieldDescriptor_ptr *)(puVar10 + 2);
      if ((_func_void_FieldDescriptor_ptr *)*puVar10 == p_Var12) {
        local_e0._16_8_ = *(undefined8 *)p_Var12;
        _Stack_c8._M_p = (pointer)puVar10[3];
        local_e0._0_8_ = local_e0 + 0x10;
      }
      else {
        local_e0._16_8_ = *(undefined8 *)p_Var12;
        local_e0._0_8_ = (_func_void_FieldDescriptor_ptr *)*puVar10;
      }
      local_e0._8_8_ = puVar10[1];
      *puVar10 = p_Var12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      this_00 = &local_88;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_e0);
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a8[0] = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_e0,local_a8)
      ;
    }
    lVar11 = 0x48;
    if (field[2] != (FieldDescriptor)0x9) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_a8[0] = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_e0,
                   local_a8);
      }
      if (field[2] != (FieldDescriptor)0xc) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x9f8);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_e0,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=(&local_101,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_e0);
      }
      lVar11 = 0x50;
    }
    (**(code **)((long)pFVar6->_vptr_FastFieldValuePrinter + lVar11))(pFVar6,this_00,generator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) {
      return;
    }
LAB_003b9d89:
    operator_delete(local_100._M_dataplus._M_p);
    break;
  case 10:
    if ((~(byte)field[1] & 0x60) == 0) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}